

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O0

int Cudd_ApaPrintMinterm(FILE *fp,DdManager *dd,DdNode *node,int nvars)

{
  int iVar1;
  int iVar2;
  DdApaNumber number;
  DdApaNumber count;
  int local_30;
  int result;
  int digits;
  int nvars_local;
  DdNode *node_local;
  DdManager *dd_local;
  FILE *fp_local;
  
  result = nvars;
  _digits = node;
  node_local = &dd->sentinel;
  dd_local = (DdManager *)fp;
  number = Cudd_ApaCountMinterm(dd,node,nvars,&local_30);
  if (number == (DdApaNumber)0x0) {
    fp_local._4_4_ = 0;
  }
  else {
    iVar1 = Cudd_ApaPrintDecimal((FILE *)dd_local,local_30,number);
    if (number != (DdApaNumber)0x0) {
      free(number);
    }
    iVar2 = fprintf((FILE *)dd_local,"\n");
    fp_local._4_4_ = iVar1;
    if (iVar2 == -1) {
      fp_local._4_4_ = 0;
    }
  }
  return fp_local._4_4_;
}

Assistant:

int
Cudd_ApaPrintMinterm(
  FILE * fp,
  DdManager * dd,
  DdNode * node,
  int  nvars)
{
    int digits;
    int result;
    DdApaNumber count;

    count = Cudd_ApaCountMinterm(dd,node,nvars,&digits);
    if (count == NULL)
        return(0);
    result = Cudd_ApaPrintDecimal(fp,digits,count);
    ABC_FREE(count);
    if (fprintf(fp,"\n") == EOF) {
        return(0);
    }
    return(result);

}